

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::UnpackUnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackUnorm4x8CaseInstance *this)

{
  ostringstream *poVar1;
  ShaderExecutor *pSVar2;
  uint6 uVar3;
  TestStatus *pTVar4;
  deUint32 dVar5;
  ostream *poVar6;
  TestLog *pTVar7;
  pointer puVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  float fVar16;
  float fVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar18;
  undefined1 auVar19 [16];
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32_3;
  deUint32 u32_5;
  deUint32 u32_7;
  deUint32 u32;
  deUint32 u32_6;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  void *in;
  deUint32 u32_2;
  deUint32 u32_4;
  Random rnd;
  Hex<8UL> local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  long local_268;
  UnpackUnorm4x8CaseInstance *local_260;
  uint local_254;
  uint local_250;
  uint local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  undefined1 local_218 [16];
  pointer local_208;
  ulong local_200;
  TestStatus *local_1f8;
  ulong local_1f0;
  undefined1 local_1e8 [16];
  TestLog local_1d8 [13];
  ios_base local_170 [264];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  deRandom local_40;
  
  local_260 = this;
  dVar5 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar5 ^ 0x776002);
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_208 = (pointer)0x0;
  local_218 = (undefined1  [16])0x0;
  local_1e8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_288,(iterator)0x0,(uint *)local_1e8);
  local_1e8._0_4_ = 0x7fff8000;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1e8._0_4_ = 0x80007fff;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1e8._0_4_ = 0xffffffff;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1e8._0_4_ = 0x1fffe;
  local_1f8 = __return_storage_ptr__;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar11 = 0x5f;
  do {
    dVar5 = deRandom_getUint32(&local_40);
    local_1e8._0_4_ = dVar5;
    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_288,
                 (iterator)
                 local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1e8);
    }
    else {
      *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar5;
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218,
             (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1e8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  local_1e8._0_8_ =
       local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_290.value = local_218._0_8_;
  pSVar2 = (local_260->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar2->_vptr_ShaderExecutor[2])
            (pSVar2,(ulong)((long)local_288.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_288.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1e8,&local_290
             ,0);
  local_200 = (ulong)((long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar12 = 0;
  if (0 < (int)local_200) {
    poVar1 = (ostringstream *)(local_1e8 + 8);
    lVar13 = 0;
    lVar10 = 0xc;
    uVar12 = 0;
    pTVar7 = (TestLog *)
             local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      uVar9 = *(uint *)((long)&pTVar7->m_log + lVar13 * 4);
      uVar3 = CONCAT24((short)(uVar9 >> 0x10),uVar9 >> 0x18) & 0xffffffffff;
      auVar14._0_4_ = (float)(int)uVar3;
      auVar14._4_4_ = (float)(ushort)(uVar3 >> 0x20);
      auVar14._8_4_ = (float)((ushort)(uVar9 >> 8) & 0xff);
      auVar14._12_4_ = (float)(uVar9 & 0xff);
      auVar15._8_4_ = 0x437f0000;
      auVar15._0_8_ = 0x437f0000437f0000;
      auVar15._12_4_ = 0x437f0000;
      auVar15 = divps(auVar14,auVar15);
      fVar16 = auVar15._4_4_;
      fVar17 = auVar15._8_4_;
      fVar18 = auVar15._12_4_;
      auVar19._4_4_ = -(uint)(1.0 < fVar16);
      auVar19._0_4_ = -(uint)(1.0 < auVar15._0_4_);
      auVar19._8_4_ = -(uint)(1.0 < fVar17);
      auVar19._12_4_ = -(uint)(1.0 < fVar18);
      uVar9 = movmskps(uVar9 & 0xff,auVar19);
      local_228 = 1.0;
      if ((uVar9 & 1) == 0) {
        local_228 = auVar15._0_4_;
      }
      local_244 = *(float *)((long)(float *)local_218._0_8_ + lVar10);
      local_254 = (int)local_244 - (int)local_228;
      if ((uint)local_244 < (uint)local_228) {
        local_254 = -((int)local_244 - (int)local_228);
      }
      local_220 = 1.0;
      fStack_64 = 0.0;
      if ((uVar9 & 2) == 0) {
        local_220 = fVar16;
        fStack_64 = fVar16;
      }
      local_240 = *(float *)((long)(float *)local_218._0_8_ + lVar10 + -4);
      local_250 = (int)local_240 - (int)local_220;
      if ((uint)local_240 < (uint)local_220) {
        local_250 = -((int)local_240 - (int)local_220);
      }
      fVar16 = 1.0;
      fStack_50 = 0.0;
      fStack_54 = 0.0;
      if ((uVar9 & 4) == 0) {
        fVar16 = fVar17;
        fStack_50 = fVar17;
        fStack_54 = fVar18;
      }
      local_238 = *(float *)((long)(float *)local_218._0_8_ + lVar10 + -8);
      local_24c = (int)local_238 - (int)fVar16;
      if ((uint)local_238 < (uint)fVar16) {
        local_24c = -((int)local_238 - (int)fVar16);
      }
      fVar17 = 1.0;
      if ((uVar9 & 8) == 0) {
        fVar17 = fVar18;
      }
      local_230 = *(float *)((long)(float *)local_218._0_8_ + lVar10 + -0xc);
      uVar9 = (int)local_230 - (int)fVar17;
      if ((uint)local_230 < (uint)fVar17) {
        uVar9 = -((int)local_230 - (int)fVar17);
      }
      local_268 = lVar13;
      local_23c = local_240;
      local_234 = local_238;
      local_22c = local_230;
      local_224 = local_228;
      local_21c = fVar17;
      local_68 = local_220;
      fStack_60 = fStack_64;
      fStack_5c = fStack_64;
      local_58 = fVar16;
      fStack_4c = fStack_54;
      if (((1 < uVar9) || (1 < local_24c)) || (1 < (local_250 | local_254))) {
        if ((int)uVar12 < 10) {
          local_1e8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          local_248 = local_244;
          local_1f0 = uVar12;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"  expected unpackUnorm4x8(",0x1a);
          local_290.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_288.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_268 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_290,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"vec4(",5);
          poVar6 = std::ostream::_M_insert<double>((double)local_21c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)fVar17;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)fVar16;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_68);
          lVar13 = local_268;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)local_220;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_224);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)local_228;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got vec4(",0xb);
          poVar6 = std::ostream::_M_insert<double>((double)local_22c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)local_230;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_234);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)local_238;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_23c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)local_240;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_244);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_290.value = (deUint64)(uint)local_248;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), max diff = ",0xe)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_170);
          uVar12 = local_1f0;
        }
        else if ((int)uVar12 == 10) {
          local_1e8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1e8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1e8 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e8 + 8));
          std::ios_base::~ios_base(local_170);
          lVar13 = local_268;
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        pTVar7 = (TestLog *)
                 local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar8 = local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar13 < (int)((ulong)((long)puVar8 - (long)pTVar7) >> 2));
  }
  local_1e8._0_8_ = ((local_260->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar11 = (int)local_200;
  std::ostream::operator<<(poVar1,iVar11 - (int)uVar12);
  pTVar4 = local_1f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  local_1e8._0_8_ = local_1d8;
  if ((int)uVar12 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Pass","");
    pTVar4->m_code = QP_TEST_RESULT_PASS;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_1e8._0_8_,
               (long)(qpTestLog **)local_1e8._0_8_ + local_1e8._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Result comparison failed","");
    pTVar4->m_code = QP_TEST_RESULT_FAIL;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_1e8._0_8_,
               (long)(qpTestLog **)local_1e8._0_8_ + local_1e8._8_8_);
  }
  if ((TestLog *)local_1e8._0_8_ != local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)((long)&(local_1d8[0].m_log)->flags + 1));
  }
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,(long)local_208 - local_218._0_8_);
  }
  if ((TestLog *)
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar4;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint8	in0		= (deUint8)(inputs[valNdx] & 0xff);
				const deUint8	in1		= (deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deUint8	in2		= (deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deUint8	in3		= (deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 255.f, 0.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 255.f, 0.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 255.f, 0.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 255.f, 0.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackUnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}